

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,
          vector<double,_std::allocator<double>_> *target,string_view name,string_view value)

{
  string_view *psVar1;
  long lVar2;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar3;
  string_view sVar4;
  optional<double> oVar5;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> splitMem;
  _Storage<double,_true> local_78;
  undefined1 local_70;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_68;
  
  local_68.data_ = (pointer)local_68.firstElement;
  local_68.len = 0;
  local_68.cap = 2;
  sVar4._M_str._0_4_ = ((this->flags).m_bits & 2) >> 1;
  sVar4._M_len = (size_t)value._M_str;
  sVar4._M_str._4_4_ = 0;
  sVar3 = parseList((slang *)value._M_len,sVar4,SUB81(&local_68,0),
                    (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                    name._M_str);
  psVar1 = sVar3._M_ptr;
  for (lVar2 = sVar3._M_extent._M_extent_value._M_extent_value << 4; lVar2 != 0;
      lVar2 = lVar2 + -0x10) {
    sVar4 = *psVar1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    value._M_str = (char *)name._M_str;
    oVar5 = parseDouble(name,sVar4,__return_storage_ptr__);
    local_78 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
    local_70 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
    if (((undefined1  [16])
         oVar5.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_0060c4dc;
    value._M_str = (char *)&local_78;
    std::vector<double,_std::allocator<double>_>::push_back
              (target,(value_type_conflict6 *)value._M_str);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    psVar1 = psVar1 + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0060c4dc:
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            (&local_68,(EVP_PKEY_CTX *)value._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<double>& target, std::string_view name,
                                     std::string_view value) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem)) {
        std::string error;
        auto result = parseDouble(name, entry, error);
        if (!result)
            return error;

        target.push_back(*result);
    }
    return {};
}